

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
miniros::Connection::setHeaderReceivedCallback(Connection *this,HeaderReceivedFunc *func)

{
  uint uVar1;
  element_type *peVar2;
  size_t in_RCX;
  Connection *in_RDI;
  anon_class_8_1_8991fb9c wrapFn;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffb8;
  function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
  *in_stack_ffffffffffffffc0;
  function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
  *in_stack_ffffffffffffffc8;
  function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
  *in_stack_ffffffffffffffd0;
  
  std::function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>::
  operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  peVar2 = std::__shared_ptr_access<miniros::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<miniros::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x42e5a4);
  uVar1 = (*peVar2->_vptr_Transport[0xb])();
  if ((uVar1 & 1) != 0) {
    std::
    function<void(std::shared_ptr<miniros::Connection>const&,std::shared_ptr<unsigned_char[]>const&,unsigned_int,bool)>
    ::
    function<miniros::Connection::setHeaderReceivedCallback(std::function<bool(std::shared_ptr<miniros::Connection>const&,miniros::Header_const&)>const&)::__0&,void>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    read(in_RDI,4,&stack0xffffffffffffffc8,in_RCX);
    std::
    function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
    ::~function((function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
                 *)0x42e5ef);
  }
  return;
}

Assistant:

void Connection::setHeaderReceivedCallback(const HeaderReceivedFunc& func)
{
  header_func_ = func;

  if (transport_->requiresHeader())
  {
    auto wrapFn = [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
    {
      this->onHeaderLengthRead(conn, buffer, size, success);
    };
    read(4, wrapFn);
  }
}